

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

int __thiscall QMessageBoxPrivate::execReturnCode(QMessageBoxPrivate *this,QAbstractButton *button)

{
  long lVar1;
  StandardButton SVar2;
  long lVar3;
  StandardButton SVar4;
  long lVar5;
  long lVar6;
  
  SVar4 = QDialogButtonBox::standardButton((QDialogButtonBox *)this->buttonBox,button);
  if (SVar4 == NoButton) {
    lVar1 = (this->customButtonList).d.size;
    SVar4 = ~NoButton;
    if (lVar1 != 0) {
      lVar6 = -8;
      do {
        if (lVar1 * -8 + lVar6 == -8) {
          return -1;
        }
        lVar5 = lVar6 + 8;
        lVar3 = lVar6 + 8;
        lVar6 = lVar5;
      } while (*(QAbstractButton **)((long)(this->customButtonList).d.ptr + lVar3) != button);
      lVar5 = lVar5 >> 3;
      SVar2 = (StandardButton)lVar5;
      SVar4 = SVar2 + 2;
      if (lVar5 < 0) {
        SVar4 = SVar2;
      }
    }
  }
  else if (this->compatMode == true) {
    SVar4 = SVar4 & 0xfffffcff;
    if ((int)SVar4 < 0x20000) {
      if ((int)SVar4 < 0x8000) {
        if (SVar4 == FirstButton) {
          return 1;
        }
        if (SVar4 == Yes) {
          return 3;
        }
      }
      else {
        if (SVar4 == YesToAll) {
          return 8;
        }
        if (SVar4 == No) {
          return 4;
        }
      }
    }
    else if ((int)SVar4 < 0x80000) {
      if (SVar4 == NoToAll) {
        return 9;
      }
      if (SVar4 == Abort) {
        return 5;
      }
    }
    else {
      if (SVar4 == Retry) {
        return 6;
      }
      if (SVar4 == Ignore) {
        return 7;
      }
      if (SVar4 == Cancel) {
        return 2;
      }
    }
    SVar4 = NoButton;
  }
  return SVar4;
}

Assistant:

int QMessageBoxPrivate::execReturnCode(QAbstractButton *button)
{
    if (int standardButton = buttonBox->standardButton(button)) {
        // When using a QMessageBox with standard buttons, the return
        // code is a StandardButton value indicating the standard button
        // that was clicked.
        if (compatMode)
            return oldButton(standardButton);
        else
            return standardButton;
    } else {
        // When using QMessageBox with custom buttons, the return code
        // is an opaque value, and the user is expected to use clickedButton()
        // to determine which button was clicked. We make sure to keep the opaque
        // value out of the QDialog::DialogCode range, so we can distinguish them.
        auto customButtonIndex = customButtonList.indexOf(button);
        if (customButtonIndex >= 0)
            return QDialog::DialogCode::Accepted + customButtonIndex + 1;
        else
            return customButtonIndex; // Not found, return -1
    }
}